

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_element_access_operator_index_Test::
~VectorSUnitTest_element_access_operator_index_Test
          (VectorSUnitTest_element_access_operator_index_Test *this)

{
  VectorSUnitTest_element_access_operator_index_Test *this_local;
  
  ~VectorSUnitTest_element_access_operator_index_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_operator_index)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v[3]);
    EXPECT_EQ(4u, v[4]);
    EXPECT_NO_THROW(v[5]);

    // const variant of at()
    vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc[0]);
    EXPECT_EQ(1u, vc[1]);
    EXPECT_EQ(2u, vc[2]);
    EXPECT_EQ(3u, vc[3]);
    EXPECT_EQ(4u, vc[4]);
    EXPECT_NO_THROW(vc[5]);
}